

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hes_Emu.cpp
# Opt level: O0

void __thiscall Hes_Emu::cpu_write_(Hes_Emu *this,hes_addr_t addr,int data)

{
  hes_time_t hVar1;
  time_t tVar2;
  uint in_EDX;
  int data_00;
  time_t *in_RSI;
  Hes_Emu *in_RDI;
  Hes_Apu *unaff_retaddr;
  hes_time_t time;
  hes_time_t t;
  int in_stack_ffffffffffffffec;
  Hes_Emu *pHVar3;
  
  data_00 = (int)in_RSI;
  if (data_00 - 0x800U < 10) {
    pHVar3 = in_RDI;
    tVar2 = Hes_Cpu::time(&in_RDI->super_Hes_Cpu,in_RSI);
    hVar1 = Hes_Cpu::end_time(&in_RDI->super_Hes_Cpu);
    ::min((int)tVar2,hVar1 + 8);
    Hes_Apu::write_data(unaff_retaddr,(blip_time_t)((ulong)pHVar3 >> 0x20),(int)pHVar3,data_00);
  }
  else {
    tVar2 = Hes_Cpu::time(&in_RDI->super_Hes_Cpu,in_RSI);
    hVar1 = (hes_time_t)tVar2;
    if ((data_00 == 0) || (data_00 - 2U < 2)) {
      cpu_write_vdp((Hes_Emu *)CONCAT44(data_00,in_EDX),in_stack_ffffffffffffffec,hVar1);
    }
    else {
      if (data_00 == 0xc00) {
        run_until(in_RDI,hVar1);
        (in_RDI->timer).raw_load = (in_EDX & 0x7f) + 1;
        recalc_timer_load(in_RDI);
        (in_RDI->timer).count = (in_RDI->timer).load;
      }
      else if (data_00 == 0xc01) {
        in_EDX = in_EDX & 1;
        if ((in_RDI->timer).enabled == in_EDX) {
          return;
        }
        run_until(in_RDI,hVar1);
        (in_RDI->timer).enabled = (byte)in_EDX;
        if (in_EDX != 0) {
          (in_RDI->timer).count = (in_RDI->timer).load;
        }
      }
      else if (data_00 == 0x1402) {
        run_until(in_RDI,hVar1);
        (in_RDI->irq).disables = (byte)in_EDX;
      }
      else if (data_00 == 0x1403) {
        run_until(in_RDI,hVar1);
        if ((in_RDI->timer).enabled != '\0') {
          (in_RDI->timer).count = (in_RDI->timer).load;
        }
        (in_RDI->timer).fired = '\0';
      }
      irq_changed(in_RDI);
    }
  }
  return;
}

Assistant:

void Hes_Emu::cpu_write_( hes_addr_t addr, int data )
{
	if ( unsigned (addr - apu.start_addr) <= apu.end_addr - apu.start_addr )
	{
		GME_APU_HOOK( this, addr - apu.start_addr, data );
		// avoid going way past end when a long block xfer is writing to I/O space
		hes_time_t t = min( time(), end_time() + 8 );
		apu.write_data( t, addr, data );
		return;
	}
	
	hes_time_t time = this->time();
	switch ( addr )
	{
	case 0x0000:
	case 0x0002:
	case 0x0003:
		cpu_write_vdp( addr, data );
		return;
	
	case 0x0C00: {
		run_until( time );
		timer.raw_load = (data & 0x7F) + 1;
		recalc_timer_load();
		timer.count = timer.load;
		break;
	}
	
	case 0x0C01:
		data &= 1;
		if ( timer.enabled == data )
			return;
		run_until( time );
		timer.enabled = data;
		if ( data )
			timer.count = timer.load;
		break;
	
	case 0x1402:
		run_until( time );
		irq.disables = data;
		if ( (data & 0xF8) && (data & 0xF8) != 0xF8 ) // flag questionable values
			debug_printf( "Int mask: $%02X\n", data );
		break;
	
	case 0x1403:
		run_until( time );
		if ( timer.enabled )
			timer.count = timer.load;
		timer.fired = false;
		break;
	
#ifndef NDEBUG
	case 0x1000: // I/O port
	case 0x0402: // palette
	case 0x0403:
	case 0x0404:
	case 0x0405:
		return;
		
	default:
		debug_printf( "unmapped write $%04X <- $%02X\n", addr, data );
		return;
#endif
	}
	
	irq_changed();
}